

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O0

void detectDrawEyes(Mat *img,Mat *img_gray)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Point PVar6;
  size_type sVar7;
  Point PVar8;
  reference pvVar9;
  size_t *psVar10;
  _InputArray local_240;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [32];
  Scalar_<double> local_1d8;
  Point_<int> local_1b8;
  _InputOutputArray local_1b0;
  int local_194;
  int r;
  Point eyes_center;
  size_t j;
  Size_<int> local_178;
  _InputArray local_170;
  undefined1 local_158 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> eyes;
  string local_138 [32];
  CascadeClassifier local_118 [8];
  CascadeClassifier eyes_cascade;
  Mat local_108 [8];
  Mat faceROI;
  ulong local_a8;
  size_t i;
  Mat local_90 [96];
  undefined1 local_30 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  Mat *img_gray_local;
  Mat *img_local;
  
  faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)img_gray;
  cv::Mat::Mat(local_90,img_gray);
  detectFaces((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30,local_90);
  cv::Mat::~Mat(local_90);
  local_a8 = 0;
  while( true ) {
    sVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                      ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30);
    if (sVar7 <= local_a8) break;
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30,local_a8);
    cv::Mat::operator()(local_108,(Rect *)img_gray);
    cv::CascadeClassifier::CascadeClassifier(local_118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml",
               (allocator<char> *)
               ((long)&eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cv::CascadeClassifier::load((string *)local_118);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158);
    cv::_InputArray::_InputArray(&local_170,local_108);
    cv::Size_<int>::Size_(&local_178,0x1e,0x1e);
    cv::Size_<int>::Size_((Size_<int> *)&j);
    psVar10 = &j;
    cv::CascadeClassifier::detectMultiScale
              (0x3ff199999999999a,local_118,&local_170,local_158,2,2,&local_178,psVar10);
    cv::_InputArray::~_InputArray(&local_170);
    eyes_center.x = 0;
    eyes_center.y = 0;
    while( true ) {
      PVar6 = eyes_center;
      PVar8 = (Point)std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                local_158);
      if ((ulong)PVar8 <= (ulong)PVar6) break;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30,
                          local_a8);
      iVar1 = pvVar9->x;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158,
                          (size_type)eyes_center);
      iVar2 = pvVar9->x;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158,
                          (size_type)eyes_center);
      iVar3 = pvVar9->width;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30,
                          local_a8);
      iVar4 = pvVar9->y;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158,
                          (size_type)eyes_center);
      iVar5 = pvVar9->y;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158,
                          (size_type)eyes_center);
      cv::Point_<int>::Point_
                ((Point_<int> *)&stack0xfffffffffffffe70,iVar1 + iVar2 + iVar3 / 2,
                 iVar4 + iVar5 + pvVar9->height / 2);
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158,
                          (size_type)eyes_center);
      iVar1 = pvVar9->width;
      pvVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158,
                          (size_type)eyes_center);
      local_194 = cvRound((double)(iVar1 + pvVar9->height) * 0.25);
      cv::_InputOutputArray::_InputOutputArray(&local_1b0,img);
      cv::Point_<int>::Point_(&local_1b8,(Point_<int> *)&stack0xfffffffffffffe70);
      iVar1 = local_194;
      cv::Scalar_<double>::Scalar_(&local_1d8,255.0,0.0,0.0,0.0);
      psVar10 = (size_t *)((ulong)psVar10 & 0xffffffff00000000);
      cv::circle(&local_1b0,&local_1b8,iVar1,&local_1d8,1,8,psVar10);
      cv::_InputOutputArray::~_InputOutputArray(&local_1b0);
      eyes_center = (Point)((long)eyes_center + 1);
    }
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_158);
    cv::CascadeClassifier::~CascadeClassifier(local_118);
    cv::Mat::~Mat(local_108);
    local_a8 = local_a8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"detect and draw eyes",&local_1f9);
  cv::namedWindow(local_1f8,1);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"detect and draw eyes",&local_221);
  cv::_InputArray::_InputArray(&local_240,img);
  cv::imshow(local_220,&local_240);
  cv::_InputArray::~_InputArray(&local_240);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30);
  return;
}

Assistant:

void detectDrawEyes(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    Mat faceROI = img_gray(faces[i]);
    CascadeClassifier eyes_cascade;
    eyes_cascade.load(
        "/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml");
    vector<Rect> eyes;
    eyes_cascade.detectMultiScale(faceROI, eyes, 1.1, 2,
                                  0 | CASCADE_SCALE_IMAGE, Size(30, 30));
    for (size_t j = 0; j < eyes.size(); j++) {
      Point eyes_center(faces[i].x + eyes[j].x + eyes[j].width / 2,
                        faces[i].y + eyes[j].y + eyes[j].height / 2);
      int r = cvRound((eyes[j].width + eyes[j].height) * 0.25);
      circle(img, eyes_center, r, Scalar(255, 0, 0), 1, 8, 0);
    }
  }
  namedWindow("detect and draw eyes");
  imshow("detect and draw eyes", img);
}